

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inipp.h
# Opt level: O1

void __thiscall inipp::Ini<wchar_t>::Ini(Ini<wchar_t> *this)

{
  _Rb_tree_header *p_Var1;
  undefined1 local_19;
  
  p_Var1 = &(this->sections)._M_t._M_impl.super__Rb_tree_header;
  (this->sections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->sections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->sections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->sections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->sections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->errors).
  super__List_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->errors;
  (this->errors).
  super__List_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->errors;
  (this->errors).
  super__List_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl._M_node._M_size = 0;
  std::__shared_ptr<inipp::Format<wchar_t>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<inipp::Format<wchar_t>>>
            ((__shared_ptr<inipp::Format<wchar_t>,(__gnu_cxx::_Lock_policy)2> *)&this->format,
             (allocator<inipp::Format<wchar_t>_> *)&local_19);
  return;
}

Assistant:

Ini(std::shared_ptr<Format<CharT>> fmt) : format(fmt) {}